

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hoardmanager.h
# Opt level: O2

void __thiscall
Hoard::
HoardManager<Hoard::AlignedSuperblockHeap<HL::SpinLockType,_262144UL,_Hoard::MmapSource>,_Hoard::GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_8,_HL::SpinLockType,_Hoard::hoardThresholdFunctionClass,_Hoard::SmallHeap>
::slowPathFree(HoardManager<Hoard::AlignedSuperblockHeap<HL::SpinLockType,_262144UL,_Hoard::MmapSource>,_Hoard::GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_8,_HL::SpinLockType,_Hoard::hoardThresholdFunctionClass,_Hoard::SmallHeap>
               *this,int binIndex,uint u,uint a)

{
  uint uVar1;
  SuperblockType *s;
  
  s = ManageOneSuperblock<Hoard::EmptyClass<Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_8>_>
      ::get((this->_otherBins)._item + binIndex);
  if (s != (SuperblockType *)0x0) {
    uVar1 = (s->_header).
            super_HoardSuperblockHeaderHelper<HL::SpinLockType,_262144,_Hoard::SmallHeap>.
            _totalObjects;
    (this->_stats)._item[binIndex]._inUse =
         (u - uVar1) +
         (s->_header).super_HoardSuperblockHeaderHelper<HL::SpinLockType,_262144,_Hoard::SmallHeap>.
         _objectsFree;
    (this->_stats)._item[binIndex]._allocated = a - uVar1;
    GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>::put
              (&this->_ph,s,0x10L << ((byte)binIndex & 0x3f));
    return;
  }
  return;
}

Assistant:

NO_INLINE void slowPathFree (int binIndex, unsigned int u, unsigned int a) {
      // We've crossed the threshold.
      // Remove a superblock and give it to the 'parent heap.'
      Check<HoardManager, sanityCheck> check (this);
    
      //	printf ("HoardManager: this = %x, getting a superblock\n", this);
    
      SuperblockType * sb = _otherBins(binIndex).get ();
    
      // We should always get one.
      assert (sb);
      if (sb) {

	auto sz = binType::getClassSize (binIndex);
	auto& stats = _stats(binIndex);
	auto totalObjects = sb->getTotalObjects();
	stats.setInUse (u - (totalObjects - sb->getObjectsFree()));
	stats.setAllocated (a - totalObjects);

	// Give it to the parent heap.
	///////// NOTE: We change the superblock type here!
	///////// THIS HAD BETTER BE SAFE!
	_ph.put (reinterpret_cast<typename ParentHeap::SuperblockType *>(sb), sz);
	assert (sb->isValidSuperblock());

      }
    }